

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional.cpp
# Opt level: O1

Data * DL::Expressions::and_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Data *pDVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  Data *d;
  Data e;
  Data local_90;
  
  d = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pDVar2 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = ((long)pDVar2 - (long)d >> 5) * -0x5555555555555555;
  if (lVar3 == 0) {
    paVar1 = &local_90.mKey.field_2;
    local_90.mKey._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    Data::Data(__return_storage_ptr__,&local_90.mKey);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mKey._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.mKey._M_dataplus._M_p,local_90.mKey.field_2._M_allocated_capacity + 1
                     );
    }
  }
  else if (lVar3 == 1) {
    VM::castTo(__return_storage_ptr__,vm,d,DT_Bool,false);
  }
  else {
    if (d == pDVar2) {
      bVar5 = true;
    }
    else {
      bVar5 = true;
      do {
        VM::castTo(&local_90,vm,d,DT_Bool,false);
        if (local_90.mType == DT_Bool) {
          if (local_90.field_2.mBool == false) {
            bVar5 = false;
          }
          bVar4 = local_90.field_2.mBool ^ 1;
        }
        else {
          bVar5 = false;
          bVar4 = 1;
          if (local_90.mType != DT_None) {
            __assert_fail("(mType == DT_Bool)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/Data.inl"
                          ,0x70,"bool DL::Data::getBool() const");
          }
        }
        Data::~Data(&local_90);
      } while ((bVar4 == 0) && (d = d + 1, d != pDVar2));
    }
    paVar1 = &local_90.mKey.field_2;
    local_90.mKey._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    Data::Data(__return_storage_ptr__,&local_90.mKey);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mKey._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.mKey._M_dataplus._M_p,local_90.mKey.field_2._M_allocated_capacity + 1
                     );
    }
    __return_storage_ptr__->mType = DT_Bool;
    (__return_storage_ptr__->field_2).mBool = bVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Data and_func(const vector_t<Data>& args, VM& vm)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return vm.castTo(args.front(), DT_Bool);
	} else {
		bool b = true;

		for (const Data& d : args) {
			Data e = vm.castTo(d, DT_Bool);
			if (!e.isValid() || !e.getBool()) {
				b = false;
				break;
			}
		}

		Data r;
		r.setBool(b);
		return r;
	}
}